

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

void empty_readdir_cb(uv_fs_t *req)

{
  void *dir;
  int iVar1;
  uv_loop_t *loop;
  uv_fs_t *puVar2;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_20 [16];
  void *local_10;
  
  dir = readdir_req.ptr;
  if (req == &readdir_req) {
    local_10 = (void *)(long)readdir_req.fs_type;
    auStack_20._8_8_ = (uv_loop_t *)0x20;
    if (local_10 != (void *)0x20) goto LAB_00188fff;
    local_10 = (void *)readdir_req.result;
    auStack_20._8_8_ = (uv_loop_t *)0x0;
    if (readdir_req.result != 0) goto LAB_0018900c;
    auStack_20._0_8_ = (void *)0x188fbc;
    uv_fs_req_cleanup(&readdir_req);
    auStack_20._0_8_ = (void *)0x188fc1;
    loop = uv_default_loop();
    auStack_20._0_8_ = (void *)0x188fda;
    iVar1 = uv_fs_closedir(loop,&closedir_req,(uv_dir_t *)dir,empty_closedir_cb);
    local_10 = (void *)(long)iVar1;
    auStack_20._8_8_ = (uv_loop_t *)0x0;
    if (local_10 == (void *)0x0) {
      return;
    }
  }
  else {
    auStack_20._0_8_ = (void *)0x188fff;
    empty_readdir_cb_cold_1();
LAB_00188fff:
    auStack_20._0_8_ = (void *)0x18900c;
    empty_readdir_cb_cold_2();
LAB_0018900c:
    auStack_20._0_8_ = (void *)0x189019;
    empty_readdir_cb_cold_3();
  }
  puVar2 = (uv_fs_t *)&stack0xfffffffffffffff0;
  auStack_20._0_8_ = empty_closedir_cb;
  empty_readdir_cb_cold_4();
  if (puVar2 == &closedir_req) {
    auStack_20._0_8_ = SEXT48(closedir_req.fs_type);
    if ((code *)auStack_20._0_8_ == (code *)0x21) {
      auStack_20._0_8_ = closedir_req.result;
      if (closedir_req.result == 0) {
        empty_closedir_cb_count = empty_closedir_cb_count + 1;
        uv_fs_req_cleanup(&closedir_req);
        return;
      }
      goto LAB_001890a2;
    }
  }
  else {
    empty_closedir_cb_cold_1();
  }
  empty_closedir_cb_cold_2();
LAB_001890a2:
  handle = (uv_handle_t *)auStack_20;
  empty_closedir_cb_cold_3();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void empty_readdir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT_PTR_EQ(req, &readdir_req);
  ASSERT_EQ(req->fs_type, UV_FS_READDIR);
  ASSERT_OK(req->result);
  dir = req->ptr;
  uv_fs_req_cleanup(req);
  r = uv_fs_closedir(uv_default_loop(),
                     &closedir_req,
                     dir,
                     empty_closedir_cb);
  ASSERT_OK(r);
}